

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O0

optional<bool> __thiscall tinyusdz::primvar::PrimVar::is_ts_value_blocked(PrimVar *this,size_t idx)

{
  bool bVar1;
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  *pvVar2;
  size_type sVar3;
  const_reference pvVar4;
  ulong in_RDX;
  size_t idx_local;
  PrimVar *this_local;
  
  bVar1 = has_timesamples((PrimVar *)idx);
  if (bVar1) {
    pvVar2 = tinyusdz::value::TimeSamples::get_samples((TimeSamples *)(idx + 0x20));
    sVar3 = ::std::
            vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ::size(pvVar2);
    if (in_RDX < sVar3) {
      pvVar2 = tinyusdz::value::TimeSamples::get_samples((TimeSamples *)(idx + 0x20));
      pvVar4 = ::std::
               vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
               ::operator[](pvVar2,in_RDX);
      nonstd::optional_lite::optional<bool>::optional<const_bool_&,_0>
                ((optional<bool> *)this,&pvVar4->blocked);
    }
    else {
      nonstd::optional_lite::optional<bool>::optional((optional<bool> *)this);
    }
  }
  else {
    nonstd::optional_lite::optional<bool>::optional((optional<bool> *)this);
  }
  return SUB82(this,0);
}

Assistant:

nonstd::optional<bool> is_ts_value_blocked(size_t idx) const {

    if (!has_timesamples()) {
      return nonstd::nullopt;
    }

    if (idx >= _ts.get_samples().size()) {
      return nonstd::nullopt;
    }

    return _ts.get_samples()[idx].blocked;
  }